

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

void __thiscall
google::protobuf::TextFormat::Printer::Print
          (Printer *this,Message *message,TextGenerator *generator)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  size_type sVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  _Base_ptr p_Var6;
  ulong uVar7;
  UnknownFieldSet *unknown_fields_00;
  _Base_ptr p_Var8;
  Reflection *this_00;
  __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
  __i;
  long lVar9;
  FieldDescriptor **ppFVar10;
  _Alloc_hider _Var11;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  UnknownFieldSet unknown_fields;
  ArrayInputStream input;
  string local_98;
  UnknownFieldSet local_78;
  FieldDescriptor **local_58;
  ArrayInputStream local_50;
  
  (*(message->super_MessageLite)._vptr_MessageLite[0x15])(message);
  if (this_00 == (Reflection *)0x0) {
    local_78.fields_.
    super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.fields_.
    super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.fields_.
    super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    MessageLite::SerializeAsString_abi_cxx11_(&local_98,&message->super_MessageLite);
    io::ArrayInputStream::ArrayInputStream
              (&local_50,local_98._M_dataplus._M_p,(int)local_98._M_string_length,-1);
    UnknownFieldSet::ParseFromZeroCopyStream(&local_78,&local_50.super_ZeroCopyInputStream);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p);
    }
    PrintUnknownFields(this,&local_78,generator);
    _Var11._M_p = (pointer)local_78.fields_.
                           super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                           ._M_impl.super__Vector_impl_data._M_start;
    if (local_78.fields_.
        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_78.fields_.
        super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      UnknownFieldSet::ClearFallback(&local_78);
      _Var11._M_p = (pointer)local_78.fields_.
                             super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                             ._M_impl.super__Vector_impl_data._M_start;
    }
  }
  else {
    iVar5 = (*(message->super_MessageLite)._vptr_MessageLite[0x15])(message);
    uVar7 = CONCAT44(extraout_var,iVar5);
    p_Var8 = (this->custom_message_printers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
    ;
    if (p_Var8 != (_Base_ptr)0x0) {
      p_Var1 = &(this->custom_message_printers_)._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = &p_Var1->_M_header;
      do {
        if (*(ulong *)(p_Var8 + 1) >= uVar7) {
          p_Var6 = p_Var8;
        }
        p_Var8 = (&p_Var8->_M_left)[*(ulong *)(p_Var8 + 1) < uVar7];
      } while (p_Var8 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var6 != p_Var1) && (*(ulong *)(p_Var6 + 1) <= uVar7)) {
        (**(code **)(*(long *)p_Var6[1]._M_parent + 0x10))
                  (p_Var6[1]._M_parent,message,this->single_line_mode_,generator);
        return;
      }
    }
    iVar5 = std::__cxx11::string::compare(*(char **)(uVar7 + 8));
    if (((iVar5 == 0) && (this->expand_any_ == true)) &&
       (bVar4 = PrintAny(this,message,generator), bVar4)) {
      return;
    }
    local_98._M_dataplus._M_p = (pointer)0x0;
    local_98._M_string_length = 0;
    local_98.field_2._M_allocated_capacity = 0;
    if (*(char *)(*(long *)(uVar7 + 0x20) + 0x4b) == '\x01') {
      local_50.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream = *(_func_int ***)(uVar7 + 0x28);
      std::
      vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
      ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*>
                ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                  *)&local_98,(iterator)0x0,(FieldDescriptor **)&local_50);
      local_50.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream =
           (_func_int **)(*(long *)(uVar7 + 0x28) + 0x98);
      if (local_98._M_string_length == local_98.field_2._M_allocated_capacity) {
        std::
        vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
        ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*>
                  ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                    *)&local_98,(iterator)local_98._M_string_length,(FieldDescriptor **)&local_50);
      }
      else {
        *(_func_int ***)local_98._M_string_length =
             local_50.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream;
        local_98._M_string_length = local_98._M_string_length + 8;
      }
    }
    else {
      Reflection::ListFields
                (this_00,message,
                 (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  *)&local_98);
    }
    sVar3 = local_98._M_string_length;
    if ((this->print_message_fields_in_index_order_ == true) &&
       (local_98._M_dataplus._M_p != (pointer)local_98._M_string_length)) {
      lVar9 = local_98._M_string_length - (long)local_98._M_dataplus._M_p;
      uVar7 = lVar9 >> 3;
      lVar2 = 0x3f;
      if (uVar7 != 0) {
        for (; uVar7 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      local_58 = (FieldDescriptor **)local_98._M_dataplus._M_p;
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::(anonymous_namespace)::FieldIndexSorter>>
                (local_98._M_dataplus._M_p,local_98._M_string_length,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e
                );
      if (lVar9 < 0x81) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::(anonymous_namespace)::FieldIndexSorter>>
                  (local_58,sVar3);
      }
      else {
        ppFVar10 = local_58 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::(anonymous_namespace)::FieldIndexSorter>>
                  (local_58,ppFVar10);
        for (; ppFVar10 != (FieldDescriptor **)sVar3; ppFVar10 = ppFVar10 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,__gnu_cxx::__ops::_Val_comp_iter<google::protobuf::(anonymous_namespace)::FieldIndexSorter>>
                    (ppFVar10);
        }
      }
    }
    if ((pointer)local_98._M_string_length != local_98._M_dataplus._M_p) {
      uVar7 = 0;
      do {
        PrintField(this,message,this_00,*(FieldDescriptor **)(local_98._M_dataplus._M_p + uVar7 * 8)
                   ,generator);
        uVar7 = uVar7 + 1;
      } while (uVar7 < (ulong)((long)(local_98._M_string_length - (long)local_98._M_dataplus._M_p)
                              >> 3));
    }
    _Var11._M_p = local_98._M_dataplus._M_p;
    if (this->hide_unknown_fields_ == false) {
      unknown_fields_00 = Reflection::GetUnknownFields(this_00,message);
      PrintUnknownFields(this,unknown_fields_00,generator);
      _Var11._M_p = local_98._M_dataplus._M_p;
    }
  }
  if ((pointer)_Var11._M_p != (pointer)0x0) {
    operator_delete(_Var11._M_p);
  }
  return;
}

Assistant:

void TextFormat::Printer::Print(const Message& message,
                                TextGenerator* generator) const {
  const Reflection* reflection = message.GetReflection();
  if (!reflection) {
    // This message does not provide any way to describe its structure.
    // Parse it again in an UnknownFieldSet, and display this instead.
    UnknownFieldSet unknown_fields;
    {
      std::string serialized = message.SerializeAsString();
      io::ArrayInputStream input(serialized.data(), serialized.size());
      unknown_fields.ParseFromZeroCopyStream(&input);
    }
    PrintUnknownFields(unknown_fields, generator);
    return;
  }
  const Descriptor* descriptor = message.GetDescriptor();
  auto itr = custom_message_printers_.find(descriptor);
  if (itr != custom_message_printers_.end()) {
    itr->second->Print(message, single_line_mode_, generator);
    return;
  }
  if (descriptor->full_name() == internal::kAnyFullTypeName && expand_any_ &&
      PrintAny(message, generator)) {
    return;
  }
  std::vector<const FieldDescriptor*> fields;
  if (descriptor->options().map_entry()) {
    fields.push_back(descriptor->field(0));
    fields.push_back(descriptor->field(1));
  } else {
    reflection->ListFields(message, &fields);
  }

  if (print_message_fields_in_index_order_) {
    std::sort(fields.begin(), fields.end(), FieldIndexSorter());
  }
  for (int i = 0; i < fields.size(); i++) {
    PrintField(message, reflection, fields[i], generator);
  }
  if (!hide_unknown_fields_) {
    PrintUnknownFields(reflection->GetUnknownFields(message), generator);
  }
}